

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_mp3.h
# Opt level: O2

void drmp3_reset(drmp3 *pMP3)

{
  pMP3->pcmFramesConsumedInMP3Frame = 0;
  pMP3->pcmFramesRemainingInMP3Frame = 0;
  pMP3->currentPCMFrame = 0;
  pMP3->dataSize = 0;
  pMP3->field_0x3ea0 = pMP3->field_0x3ea0 & 0xfe;
  (pMP3->decoder).header[0] = '\0';
  return;
}

Assistant:

static void drmp3_reset(drmp3* pMP3)
{
    DRMP3_ASSERT(pMP3 != NULL);

    pMP3->pcmFramesConsumedInMP3Frame = 0;
    pMP3->pcmFramesRemainingInMP3Frame = 0;
    pMP3->currentPCMFrame = 0;
    pMP3->dataSize = 0;
    pMP3->atEnd = DRMP3_FALSE;
    drmp3dec_init(&pMP3->decoder);
}